

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::swap(hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
       *this,hash_map_type *other)

{
  vector<crnlib::hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
  *in_RSI;
  vector<crnlib::hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
  *in_RDI;
  
  vector<crnlib::hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
  ::swap(in_RSI,in_RDI);
  utils::swap<unsigned_int>((uint *)(in_RDI + 1),(uint *)(in_RSI + 1));
  utils::swap<unsigned_int>(&in_RDI[1].m_size,&in_RSI[1].m_size);
  utils::swap<unsigned_int>(&in_RDI[1].m_capacity,&in_RSI[1].m_capacity);
  utils::swap<crnlib::hasher<unsigned_long_long>>
            ((hasher<unsigned_long_long> *)((long)&in_RDI[1].m_p + 4),
             (hasher<unsigned_long_long> *)((long)&in_RSI[1].m_p + 4));
  utils::swap<crnlib::equal_to<unsigned_long_long>>
            ((equal_to<unsigned_long_long> *)((long)&in_RDI[1].m_p + 5),
             (equal_to<unsigned_long_long> *)((long)&in_RSI[1].m_p + 5));
  return;
}

Assistant:

inline void swap(hash_map_type& other) {
    m_values.swap(other.m_values);
    utils::swap(m_hash_shift, other.m_hash_shift);
    utils::swap(m_num_valid, other.m_num_valid);
    utils::swap(m_grow_threshold, other.m_grow_threshold);
    utils::swap(m_hasher, other.m_hasher);
    utils::swap(m_equals, other.m_equals);
  }